

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchpriority.cpp
# Opt level: O2

void ScheduleBatchPriority(void)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  pthread_t __target_thread;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int in_stack_ffffffffffffff0c;
  string local_d0 [128];
  string local_50;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __target_thread = pthread_self();
  iVar3 = pthread_setschedparam(__target_thread,3,(sched_param *)&ScheduleBatchPriority::param);
  if (iVar3 != 0) {
    SysErrorString_abi_cxx11_(in_stack_ffffffffffffff0c);
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar4);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<std::__cxx11::string>
                (&local_50,(tinyformat *)"Failed to pthread_setschedparam: %s\n",(char *)local_d0,
                 in_RCX);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pLVar4 = LogInstance();
      local_50._M_dataplus._M_p = (pointer)0x5f;
      local_50._M_string_length = 0x737df2;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/batchpriority.cpp"
      ;
      source_file._M_len = 0x5f;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "ScheduleBatchPriority";
      logging_function._M_len = 0x15;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x17,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string(local_d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ScheduleBatchPriority()
{
#ifdef SCHED_BATCH
    const static sched_param param{};
    const int rc = pthread_setschedparam(pthread_self(), SCHED_BATCH, &param);
    if (rc != 0) {
        LogPrintf("Failed to pthread_setschedparam: %s\n", SysErrorString(rc));
    }
#endif
}